

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O3

void __thiscall
irr::video::CImage::copyToScalingBoxFilter(CImage *this,IImage *target,s32 bias,bool blend)

{
  dimension2d<unsigned_int> dVar1;
  bool bVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  uint uVar17;
  float fVar18;
  float __x;
  undefined4 extraout_XMM0_Db;
  int iVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float local_cc;
  uint local_c8;
  uint local_9c;
  IImage *local_98;
  CImage *local_90;
  undefined8 local_88;
  dimension2d<unsigned_int> local_78;
  undefined8 uStack_70;
  ulong local_68;
  ulong local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_78 = target->Size;
  local_68 = (ulong)local_78 >> 0x20;
  if (local_68 != 0) {
    dVar1 = (this->super_IImage).Size;
    auVar19._0_8_ = (ulong)dVar1 & 0xffffffff;
    auVar19._8_4_ = dVar1.Height;
    auVar19._12_4_ = 0;
    auVar24._0_4_ = (float)(SUB168(auVar19 | _DAT_0022c050,0) - (double)DAT_0022c050);
    auVar24._4_4_ = (float)(SUB168(auVar19 | _DAT_0022c050,8) - DAT_0022c050._8_8_);
    auVar24._8_8_ = 0;
    uStack_70 = 0;
    auVar20._0_8_ = (ulong)local_78 & 0xffffffff;
    auVar20._8_4_ = local_78.Height;
    auVar20._12_4_ = 0;
    auVar21._0_4_ = (float)(SUB168(auVar20 | _DAT_0022c050,0) - (double)DAT_0022c050);
    auVar21._4_4_ = (float)(SUB168(auVar20 | _DAT_0022c050,8) - DAT_0022c050._8_8_);
    auVar21._8_8_ = 0;
    local_58 = divps(auVar24,auVar21);
    local_90 = this;
    fVar16 = ceilf(local_58._0_4_);
    local_88 = CONCAT44(extraout_XMM0_Db,fVar16);
    local_48 = (float)local_58._4_4_;
    fStack_44 = (float)local_58._4_4_;
    fStack_40 = (float)local_58._4_4_;
    fStack_3c = (float)local_58._4_4_;
    fVar16 = ceilf((float)local_58._4_4_);
    uVar17 = (uint)(float)local_88;
    iVar22 = (int)fVar16;
    uVar3 = local_78.Width;
    auVar23._0_4_ = -(uint)(uVar17 == 0);
    auVar23._4_4_ = -(uint)(uVar17 == 0);
    auVar23._8_4_ = -(uint)(iVar22 == 0);
    auVar23._12_4_ = -(uint)(iVar22 == 0);
    uVar4 = movmskpd(extraout_EAX,auVar23);
    local_cc = 0.0;
    local_c8 = 0;
    local_98 = target;
    do {
      if (uVar3 != 0) {
        fVar16 = floorf(local_cc);
        __x = 0.0;
        uVar14 = 0;
        do {
          fVar18 = floorf(__x);
          iVar10 = 0;
          iVar12 = 0;
          iVar11 = 0;
          iVar13 = 0;
          bVar5 = 0;
          if ((uVar4 & 1) == 0) {
            local_60 = (ulong)(uint)(int)fVar18;
            iVar10 = 0;
            iVar12 = 0;
            uVar6 = 0;
            iVar11 = 0;
            iVar13 = 0;
            do {
              local_88 = uVar6;
              if ((byte)((byte)uVar4 >> 1) == 0) {
                local_78.Width = (int)local_60 + (int)uVar6;
                uVar15 = (int)fVar16;
                iVar8 = iVar22;
                do {
                  uVar9 = (local_90->super_IImage).Size.Width - 1;
                  if ((int)local_78.Width < (int)uVar9) {
                    uVar9 = local_78.Width;
                  }
                  uVar7 = (local_90->super_IImage).Size.Height - 1;
                  if ((int)uVar15 < (int)uVar7) {
                    uVar7 = uVar15;
                  }
                  uVar9 = (*(local_90->super_IImage)._vptr_IImage[2])
                                    (local_90,(ulong)uVar9,(ulong)uVar7);
                  iVar10 = iVar10 + (uVar9 >> 0x18);
                  iVar12 = iVar12 + (uVar9 >> 0x10 & 0xff);
                  iVar13 = iVar13 + (uVar9 >> 8 & 0xff);
                  iVar11 = iVar11 + (uVar9 & 0xff);
                  uVar15 = uVar15 + 1;
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
              }
              uVar15 = (int)local_88 + 1;
              uVar6 = (ulong)uVar15;
            } while (uVar15 != uVar17);
            bVar5 = 0;
            target = local_98;
            if (1 < iVar22 * uVar17) {
              bVar5 = 0;
              uVar15 = iVar22 * uVar17;
              do {
                bVar5 = bVar5 + 1;
                bVar2 = 3 < uVar15;
                uVar15 = uVar15 >> 1;
              } while (bVar2);
            }
          }
          iVar10 = (iVar10 >> (bVar5 & 0x1f)) + bias;
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          iVar12 = (iVar12 >> (bVar5 & 0x1f)) + bias;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          uVar15 = (iVar13 >> (bVar5 & 0x1f)) + bias;
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          if (0xfe < (int)uVar15) {
            uVar15 = 0xff;
          }
          uVar9 = (iVar11 >> (bVar5 & 0x1f)) + bias;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if (0xfe < (int)uVar9) {
            uVar9 = 0xff;
          }
          local_9c = uVar15 << 8 | uVar9 | iVar12 << 0x10 | iVar10 << 0x18;
          (*target->_vptr_IImage[3])(target,uVar14,(ulong)local_c8,&local_9c,(ulong)blend);
          __x = __x + (float)local_58._0_4_;
          uVar15 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar15;
        } while (uVar15 != uVar3);
      }
      local_cc = local_cc + local_48;
      local_c8 = local_c8 + 1;
    } while (local_c8 != (uint)local_68);
  }
  return;
}

Assistant:

void CImage::copyToScalingBoxFilter(IImage *target, s32 bias, bool blend)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToScalingBoxFilter method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	const core::dimension2d<u32> destSize = target->getDimension();

	const f32 sourceXStep = (f32)Size.Width / (f32)destSize.Width;
	const f32 sourceYStep = (f32)Size.Height / (f32)destSize.Height;

	s32 fx = core::ceil32(sourceXStep);
	s32 fy = core::ceil32(sourceYStep);
	f32 sx;
	f32 sy;

	sy = 0.f;
	for (u32 y = 0; y != destSize.Height; ++y) {
		sx = 0.f;
		for (u32 x = 0; x != destSize.Width; ++x) {
			target->setPixel(x, y,
					getPixelBox(core::floor32(sx), core::floor32(sy), fx, fy, bias), blend);
			sx += sourceXStep;
		}
		sy += sourceYStep;
	}
}